

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

int CVmObjList::getp_car(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  
  if (getp_car(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_car(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc
                               );
    if (iVar1 != 0) {
      getp_car::desc.min_argc_ = 0;
      getp_car::desc.opt_argc_ = 0;
      getp_car::desc.varargs_ = 0;
      __cxa_guard_release(&getp_car(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_car::desc);
  if (iVar1 == 0) {
    if (*(short *)lst == 0) {
      retval->typ = VM_NIL;
    }
    else {
      vmb_get_dh(lst + 2,retval);
    }
  }
  return 1;
}

Assistant:

int CVmObjList::getp_car(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                         const char *lst, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* 
     *   if the list has at least one element, return it; otherwise return
     *   nil 
     */
    if (vmb_get_len(lst) == 0)
    {
        /* no elements - return nil */
        retval->set_nil();
    }
    else
    {
        /* it has at least one element - return the first element */
        vmb_get_dh(lst + VMB_LEN, retval);
    }

    /* handled */
    return TRUE;
}